

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

size_t __thiscall
binlog::Session::consumeSpecialEntry<binlog::WriterProp,std::ostream>
          (Session *this,WriterProp *entry,basic_ostream<char,_std::char_traits<char>_> *out)

{
  pointer pcVar1;
  size_t sVar2;
  
  pcVar1 = (this->_specialEntryBuffer).vector.super__Vector_base<char,_std::allocator<char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_specialEntryBuffer).vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->_specialEntryBuffer).vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  sVar2 = serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                    (entry,&this->_specialEntryBuffer);
  std::ostream::write((char *)out,
                      (long)(this->_specialEntryBuffer).vector.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
  return sVar2;
}

Assistant:

std::size_t Session::consumeSpecialEntry(const Entry& entry, OutputStream& out)
{
  // Write entry to `_specialEntryBuffer` first, only then to `out` in one go.
  // This makes OutputStream logic simpler (if it parses the stream),
  // as it does not have to deal with partial entries.
  // (serializeSizePrefixedTagged serializes Entry field by field)
  // This is also more efficient if OutputStream does unbuffered I/O.
  _specialEntryBuffer.clear();
  const std::size_t size = serializeSizePrefixedTagged(entry, _specialEntryBuffer);
  out.write(_specialEntryBuffer.data(), _specialEntryBuffer.ssize());
  return size;
}